

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VROffAxisProjectionNode.cpp
# Opt level: O2

void __thiscall
MinVR::VROffAxisProjectionNode::render
          (VROffAxisProjectionNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  float fVar1;
  float fVar2;
  float fVar3;
  VRAnyCoreType t;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  allocator<char> local_30d;
  float local_30c;
  float local_308;
  float local_304;
  VRVector3 vu;
  VRVector3 vr;
  VRMatrix4 projMat;
  VRVector3 vn;
  VRPoint3 pe;
  string local_248;
  VRVector3 va;
  VRPoint3 pa;
  VRPoint3 pc;
  VRPoint3 pb;
  VRMatrix4 Mrot;
  VRVector3 vc;
  VRVector3 vb;
  string local_150;
  VRMatrix4 viewMat;
  VRMatrix4 Mtrans;
  string local_a0;
  string local_80;
  VRMatrix4 cameraMatrix;
  
  VRDataIndex::pushState(renderState);
  VRPoint3::VRPoint3(&pa,&this->_botLeft);
  VRPoint3::VRPoint3(&pb,&this->_botRight);
  VRPoint3::VRPoint3(&pc,&this->_topLeft);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&projMat,"CameraMatrix",(allocator<char> *)&Mrot);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"",(allocator<char> *)&Mtrans);
  t = VRDataIndex::getValue(renderState,(string *)&projMat,&local_150,true);
  VRMatrix4::VRMatrix4(&cameraMatrix,t);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&projMat);
  VRPoint3::VRPoint3((VRPoint3 *)&projMat,0.0,0.0,0.0);
  VRMatrix4::getColumn((VRVector3 *)&Mrot,&cameraMatrix,3);
  operator+(&pe,(VRPoint3 *)&projMat,(VRVector3 *)&Mrot);
  VRVector3::~VRVector3((VRVector3 *)&Mrot);
  VRPoint3::~VRPoint3((VRPoint3 *)&projMat);
  operator-((VRVector3 *)&projMat,&pb,&pa);
  VRVector3::normalize(&vr,(VRVector3 *)&projMat);
  VRVector3::~VRVector3((VRVector3 *)&projMat);
  operator-((VRVector3 *)&projMat,&pc,&pa);
  VRVector3::normalize(&vu,(VRVector3 *)&projMat);
  VRVector3::~VRVector3((VRVector3 *)&projMat);
  VRVector3::cross((VRVector3 *)&projMat,&vr,&vu);
  VRVector3::normalize(&vn,(VRVector3 *)&projMat);
  VRVector3::~VRVector3((VRVector3 *)&projMat);
  operator-(&va,&pa,&pe);
  operator-(&vb,&pb,&pe);
  operator-(&vc,&pc,&pe);
  fVar5 = VRVector3::dot(&va,&vn);
  fVar6 = VRVector3::dot(&vr,&va);
  fVar1 = this->_nearClip;
  fVar7 = VRVector3::dot(&vr,&vb);
  fVar2 = this->_nearClip;
  fVar8 = VRVector3::dot(&vu,&va);
  fVar3 = this->_nearClip;
  fVar9 = VRVector3::dot(&vu,&vc);
  fVar5 = -fVar5;
  VRMatrix4::projection
            (&projMat,(fVar6 * fVar1) / fVar5,(fVar7 * fVar2) / fVar5,(fVar8 * fVar3) / fVar5,
             (fVar9 * this->_nearClip) / fVar5,this->_nearClip,this->_farClip);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&Mrot,"ProjectionMatrix",(allocator<char> *)&Mtrans);
  VRDataIndex::addData(&local_80,renderState,(string *)&Mrot,&projMat.super_VRFloatArrayConvertible)
  ;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&Mrot);
  pfVar4 = VRVector3::operator[](&vr,0);
  fVar1 = *pfVar4;
  pfVar4 = VRVector3::operator[](&vr,1);
  fVar2 = *pfVar4;
  pfVar4 = VRVector3::operator[](&vr,2);
  fVar3 = *pfVar4;
  pfVar4 = VRVector3::operator[](&vu,0);
  fVar5 = *pfVar4;
  pfVar4 = VRVector3::operator[](&vu,1);
  fVar6 = *pfVar4;
  pfVar4 = VRVector3::operator[](&vu,2);
  local_304 = *pfVar4;
  pfVar4 = VRVector3::operator[](&vn,0);
  local_308 = *pfVar4;
  pfVar4 = VRVector3::operator[](&vn,1);
  local_30c = *pfVar4;
  pfVar4 = VRVector3::operator[](&vn,2);
  VRMatrix4::fromRowMajorElements
            (&Mrot,fVar1,fVar2,fVar3,0.0,fVar5,fVar6,local_304,0.0,local_308,local_30c,*pfVar4,0.0,
             0.0,0.0,0.0,1.0);
  VRPoint3::VRPoint3((VRPoint3 *)&local_248,0.0,0.0,0.0);
  operator-((VRVector3 *)&viewMat,(VRPoint3 *)&local_248,&pe);
  VRMatrix4::translation(&Mtrans,(VRVector3 *)&viewMat);
  VRVector3::~VRVector3((VRVector3 *)&viewMat);
  VRPoint3::~VRPoint3((VRPoint3 *)&local_248);
  operator*(&viewMat,&Mrot,&Mtrans);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"ViewMatrix",&local_30d);
  VRDataIndex::addData(&local_a0,renderState,&local_248,&viewMat.super_VRFloatArrayConvertible);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_248);
  VRDisplayNode::render(&this->super_VRDisplayNode,renderState,renderHandler);
  VRDataIndex::popState(renderState);
  VRMatrix4::~VRMatrix4(&viewMat);
  VRMatrix4::~VRMatrix4(&Mtrans);
  VRMatrix4::~VRMatrix4(&Mrot);
  VRMatrix4::~VRMatrix4(&projMat);
  VRVector3::~VRVector3(&vc);
  VRVector3::~VRVector3(&vb);
  VRVector3::~VRVector3(&va);
  VRVector3::~VRVector3(&vn);
  VRVector3::~VRVector3(&vu);
  VRVector3::~VRVector3(&vr);
  VRPoint3::~VRPoint3(&pe);
  VRMatrix4::~VRMatrix4(&cameraMatrix);
  VRPoint3::~VRPoint3(&pc);
  VRPoint3::~VRPoint3(&pb);
  VRPoint3::~VRPoint3(&pa);
  return;
}

Assistant:

void
VROffAxisProjectionNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
	renderState->pushState();

	// This projection code follows the math described in this paper:
	// http://csc.lsu.edu/~kooima/pdfs/gen-perspective.pdf

	VRPoint3 pa = _botLeft;
	VRPoint3 pb = _botRight;
	VRPoint3 pc = _topLeft;
  VRMatrix4 cameraMatrix = renderState->getValue("CameraMatrix");
  VRPoint3 pe = VRPoint3(0,0,0) + cameraMatrix.getColumn(3);

	// Compute an orthonormal basis for the screen
	VRVector3 vr = (pb - pa).normalize();
	VRVector3 vu = (pc - pa).normalize();
	VRVector3 vn = vr.cross(vu).normalize();

	// Compute the screen corner vectors
	VRVector3 va = pa - pe;
	VRVector3 vb = pb - pe;
	VRVector3 vc = pc - pe;

	// Find the distance from the eye to screen plane
	float d = -va.dot(vn);

	// Find the extent of the perpendicular projection
	float l = vr.dot(va) * _nearClip / d;
	float r = vr.dot(vb) * _nearClip / d;
	float b = vu.dot(va) * _nearClip / d;
	float t = vu.dot(vc) * _nearClip / d;

	VRMatrix4 projMat = VRMatrix4::projection(l, r, b, t, _nearClip, _farClip);

	renderState->addData("ProjectionMatrix", projMat);

	// Rotate the projection to be non-perpendicular
    VRMatrix4 Mrot = VRMatrix4::fromRowMajorElements(vr[0], vr[1], vr[2], 0.0,
                                                     vu[0], vu[1], vu[2], 0.0,
                                                     vn[0], vn[1], vn[2], 0.0,
                                                     0.0, 0.0, 0.0, 1.0);

	// Move the apex of the frustum to the origin
	VRMatrix4 Mtrans = VRMatrix4::translation(VRPoint3(0, 0, 0) - pe);

	VRMatrix4 viewMat = Mrot * Mtrans;

	renderState->addData("ViewMatrix", viewMat);

	VRDisplayNode::render(renderState, renderHandler);

	renderState->popState();
}